

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

keypress textui_textblock_show(textblock *tb,region_conflict orig_area,char *header)

{
  wchar_t x;
  region_conflict rVar1;
  undefined1 auVar2 [16];
  wchar_t y;
  int iVar3;
  size_t n_lines_00;
  wchar_t *pwVar4;
  uint8_t *puVar5;
  undefined8 extraout_RDX;
  keypress kVar7;
  int local_64;
  int iStack_60;
  wchar_t start_line;
  size_t n_lines;
  size_t *line_lengths;
  size_t *line_starts;
  region_conflict area;
  char *header_local;
  textblock *tb_local;
  region_conflict orig_area_local;
  keypress ch;
  undefined8 uVar6;
  
  orig_area_local._0_8_ = orig_area._8_8_;
  area._8_8_ = header;
  _line_starts = region_calculate(orig_area);
  line_lengths = (size_t *)0x0;
  n_lines = 0;
  memset(&orig_area_local.width,0,0xc);
  n_lines_00 = textblock_calculate_lines(tb,&line_lengths,(size_t **)&n_lines,(long)area.col);
  screen_save();
  rVar1 = _line_starts;
  iVar3 = area.row;
  area.row = area.row + -2;
  if (area._8_8_ != 0) {
    area.row = iVar3 + -3;
    auVar2 = (undefined1  [16])_line_starts;
    line_starts._0_4_ = rVar1.col;
    x = (wchar_t)line_starts;
    line_starts._4_4_ = rVar1.row;
    y = line_starts._4_4_;
    area.col = rVar1.width;
    iVar3 = area.col;
    _line_starts = (region_conflict)auVar2;
    Term_erase(x,y,iVar3);
    c_put_str('\x0e',(char *)area._8_8_,line_starts._4_4_,(wchar_t)line_starts);
    line_starts = (size_t *)CONCAT44(line_starts._4_4_ + 1,(wchar_t)line_starts);
  }
  iStack_60 = (int)n_lines_00;
  if (n_lines_00 <= (ulong)(long)area.row) {
    pwVar4 = textblock_text(tb);
    puVar5 = textblock_attrs(tb);
    display_area(pwVar4,puVar5,line_lengths,(size_t *)n_lines,n_lines_00,_line_starts,0);
    Term_erase((wchar_t)line_starts,line_starts._4_4_ + iStack_60,area.col);
    Term_erase((wchar_t)line_starts,line_starts._4_4_ + 1 + iStack_60,area.col);
    c_put_str('\x0e',"(Press any key to continue.)",line_starts._4_4_ + 1 + iStack_60,
              (wchar_t)line_starts);
    kVar7 = inkey();
    ch.type._0_1_ = kVar7.mods;
    uVar6 = kVar7._0_8_;
LAB_00267f1b:
    orig_area_local._8_8_ = uVar6;
    mem_free(line_lengths);
    mem_free((void *)n_lines);
    screen_load();
    kVar7._8_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),(undefined1)ch.type);
    kVar7.type = orig_area_local.width;
    kVar7.code = orig_area_local.page_rows;
    return kVar7;
  }
  local_64 = 0;
  Term_erase((wchar_t)line_starts,line_starts._4_4_ + area.row,area.col);
  Term_erase((wchar_t)line_starts,line_starts._4_4_ + area.row + L'\x01',area.col);
  c_put_str('\x0e',"(Up/down or ESCAPE to exit.)",line_starts._4_4_ + area.row + L'\x01',
            (wchar_t)line_starts);
  do {
    pwVar4 = textblock_text(tb);
    puVar5 = textblock_attrs(tb);
    display_area(pwVar4,puVar5,line_lengths,(size_t *)n_lines,n_lines_00,_line_starts,(long)local_64
                );
    kVar7 = inkey();
    uVar6 = kVar7._0_8_;
    ch.type._0_1_ = kVar7.mods;
    orig_area_local.page_rows = kVar7.code;
    if (orig_area_local.page_rows == 0x83) {
      local_64 = local_64 + -1;
    }
    else {
      if ((((orig_area_local.page_rows == 0xe000) || (orig_area_local.page_rows == 0x71)) ||
          (orig_area_local.page_rows == 0x78)) ||
         ((orig_area_local.page_rows == 0x5d || (orig_area_local.page_rows == 0x5b))))
      goto LAB_00267f1b;
      if (orig_area_local.page_rows == 0x80) {
        local_64 = local_64 + 1;
      }
      else if (orig_area_local.page_rows == 0x20) {
        local_64 = area.row + local_64;
      }
    }
    if (local_64 < 0) {
      local_64 = 0;
    }
    orig_area_local._8_8_ = uVar6;
    if (n_lines_00 < (ulong)((long)local_64 + (long)area.row)) {
      local_64 = iStack_60 - area.row;
    }
  } while( true );
}

Assistant:

struct keypress textui_textblock_show(textblock *tb, region orig_area, const char *header)
{
	/* xxx on resize this should be recalculated */
	region area = region_calculate(orig_area);

	size_t *line_starts = NULL, *line_lengths = NULL;
	size_t n_lines;

	struct keypress ch = KEYPRESS_NULL;

	n_lines = textblock_calculate_lines(tb,
			&line_starts, &line_lengths, area.width);

	screen_save();

	/* make room for the footer */
	area.page_rows -= 2;

	if (header != NULL) {
		area.page_rows--;
		Term_erase(area.col, area.row, area.width);
		c_put_str(COLOUR_L_BLUE, header, area.row, area.col);
		area.row++;
	}

	if (n_lines > (size_t) area.page_rows) {
		int start_line = 0;

		Term_erase(area.col, area.row + area.page_rows, area.width);
		Term_erase(area.col, area.row + area.page_rows + 1, area.width);
		c_put_str(COLOUR_L_BLUE, "(Up/down or ESCAPE to exit.)",
				area.row + area.page_rows + 1, area.col);

		/* Pager mode */
		while (1) {			

			display_area(textblock_text(tb), textblock_attrs(tb), line_starts,
					line_lengths, n_lines, area, start_line);

			ch = inkey();
			if (ch.code == ARROW_UP)
				start_line--;
			else if (ch.code == ESCAPE || ch.code == 'q' || ch.code == 'x')
				break;
			else if (ch.code == ']' || ch.code == '[')
				/* Special case to deal with monster and object lists -
				 * see bug #2120 */
				break;
			else if (ch.code == ARROW_DOWN)
				start_line++;
			else if (ch.code == ' ')
				start_line += area.page_rows;

			if (start_line < 0)
				start_line = 0;
			if (start_line + (size_t) area.page_rows > n_lines)
				start_line = n_lines - area.page_rows;
		}
	} else {
		display_area(textblock_text(tb), textblock_attrs(tb), line_starts,
				line_lengths, n_lines, area, 0);

		Term_erase(area.col, area.row + n_lines, area.width);
		Term_erase(area.col, area.row + n_lines + 1, area.width);
		c_put_str(COLOUR_L_BLUE, "(Press any key to continue.)",
				area.row + n_lines + 1, area.col);
		ch = inkey();
	}

	mem_free(line_starts);
	mem_free(line_lengths);

	screen_load();

	return (ch);
}